

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Signal_PDU::SetData(Signal_PDU *this,KOCTET *D,KUINT16 Length)

{
  size_type sVar1;
  byte local_38;
  value_type local_21;
  byte local_20;
  byte local_1f;
  ushort local_1e;
  ushort local_1c;
  ushort local_1a;
  KUINT8 i_1;
  KUINT8 ui8PaddingNeeded;
  KUINT16 i;
  KUINT16 uiDataSz;
  KUINT16 Length_local;
  KOCTET *D_local;
  Signal_PDU *this_local;
  
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength = 0x20;
  local_1a = Length;
  _i_1 = D;
  D_local = (KOCTET *)this;
  std::vector<char,_std::allocator<char>_>::clear(&this->m_vData);
  local_1c = local_1a / 8;
  std::vector<char,_std::allocator<char>_>::reserve(&this->m_vData,(ulong)local_1c);
  for (local_1e = 0; local_1e < local_1c; local_1e = local_1e + 1) {
    std::vector<char,_std::allocator<char>_>::push_back(&this->m_vData,_i_1);
    _i_1 = _i_1 + 1;
  }
  sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->m_vData);
  this->m_ui16DataLength = (KUINT16)(sVar1 << 3);
  sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->m_vData);
  if ((sVar1 & 3) == 0) {
    local_38 = 0;
  }
  else {
    sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->m_vData);
    local_38 = 4 - ((byte)sVar1 & 3);
  }
  local_1f = local_38;
  for (local_20 = 0; local_20 < local_1f; local_20 = local_20 + 1) {
    local_21 = '\0';
    std::vector<char,_std::allocator<char>_>::push_back(&this->m_vData,&local_21);
  }
  sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->m_vData);
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength =
       (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength +
       (short)sVar1;
  return;
}

Assistant:

void Signal_PDU::SetData( const KOCTET * D, KUINT16 Length )
{
    // If we already have data clear it first.
    m_ui16PDULength = SIGNAL_PDU_SIZE;
    m_vData.clear();

    // Copy data into the vector
    KUINT16 uiDataSz = Length / 8;
    m_vData.reserve( uiDataSz );
    for( KUINT16 i = 0; i < uiDataSz; ++i, ++D )
    {
        m_vData.push_back( *D );
    }

    // Data length does not include the padding
    m_ui16DataLength = m_vData.size() * 8;

    // Do we need to apply padding, the PDU size should be a multiple
    // of 32 bits / 4 octets.
    KUINT8 ui8PaddingNeeded = m_vData.size() % 4 == 0 ? 0 : (4 - m_vData.size() % 4); // Add padding;
    for( KUINT8 i = 0; i < ui8PaddingNeeded; ++ i )
    {
        m_vData.push_back( 0 );
    }

    // Update lengths
    m_ui16PDULength += m_vData.size();
}